

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_RGBNIR14_v3::~LASreadItemCompressed_RGBNIR14_v3
          (LASreadItemCompressed_RGBNIR14_v3 *this)

{
  ArithmeticDecoder *pAVar1;
  uint local_14;
  U32 c;
  LASreadItemCompressed_RGBNIR14_v3 *this_local;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b02a8;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (this->contexts[local_14].m_rgb_bytes_used != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_bytes_used)
      ;
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_0);
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_1);
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_2);
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_3);
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_4);
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,this->contexts[local_14].m_rgb_diff_5);
    }
    if (this->contexts[local_14].m_nir_bytes_used != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_NIR,this->contexts[local_14].m_nir_bytes_used)
      ;
      ArithmeticDecoder::destroySymbolModel(this->dec_NIR,this->contexts[local_14].m_nir_diff_0);
      ArithmeticDecoder::destroySymbolModel(this->dec_NIR,this->contexts[local_14].m_nir_diff_1);
    }
  }
  if (this->instream_RGB != (ByteStreamInArray *)0x0) {
    if (this->instream_RGB != (ByteStreamInArray *)0x0) {
      (*(this->instream_RGB->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    }
    pAVar1 = this->dec_RGB;
    if (pAVar1 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(pAVar1);
      operator_delete(pAVar1);
    }
  }
  if (this->instream_NIR != (ByteStreamInArray *)0x0) {
    if (this->instream_NIR != (ByteStreamInArray *)0x0) {
      (*(this->instream_NIR->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    }
    pAVar1 = this->dec_NIR;
    if (pAVar1 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(pAVar1);
      operator_delete(pAVar1);
    }
  }
  if ((this->bytes != (U8 *)0x0) && (this->bytes != (U8 *)0x0)) {
    operator_delete__(this->bytes);
  }
  LASreadItemCompressed::~LASreadItemCompressed(&this->super_LASreadItemCompressed);
  return;
}

Assistant:

LASreadItemCompressed_RGBNIR14_v3::~LASreadItemCompressed_RGBNIR14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_rgb_bytes_used)
    {
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_bytes_used);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_0);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_1);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_2);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_3);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_4);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_5);
    }

    if (contexts[c].m_nir_bytes_used)
    {
      dec_NIR->destroySymbolModel(contexts[c].m_nir_bytes_used);
      dec_NIR->destroySymbolModel(contexts[c].m_nir_diff_0);
      dec_NIR->destroySymbolModel(contexts[c].m_nir_diff_1);
    }
  }

  /* destroy all instreams and decoders */

  if (instream_RGB)
  {
    delete instream_RGB;

    delete dec_RGB;
  }

  if (instream_NIR)
  {
    delete instream_NIR;

    delete dec_NIR;
  }

  if (bytes) delete [] bytes;
}